

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O1

int ARGB1555ToARGB(uint8_t *src_argb1555,int src_stride_argb1555,uint8_t *dst_argb,
                  int dst_stride_argb,int width,int height)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  code *pcVar4;
  
  iVar3 = -1;
  if ((height != 0 && 0 < width) && (dst_argb != (uint8_t *)0x0 && src_argb1555 != (uint8_t *)0x0))
  {
    iVar1 = height;
    if (height < 0) {
      iVar1 = -height;
      src_argb1555 = src_argb1555 + ~height * src_stride_argb1555;
      src_stride_argb1555 = -src_stride_argb1555;
    }
    if (width * 4 == dst_stride_argb && width * 2 == src_stride_argb1555) {
      width = iVar1 * width;
      src_stride_argb1555 = 0;
      dst_stride_argb = 0;
      iVar1 = 1;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    if ((width & 7U) == 0) {
      pcVar4 = ARGB1555ToARGBRow_SSE2;
    }
    else {
      pcVar4 = ARGB1555ToARGBRow_Any_SSE2;
    }
    if ((uVar2 & 0x20) == 0) {
      pcVar4 = ARGB1555ToARGBRow_C;
    }
    iVar3 = 0;
    if (0 < iVar1) {
      do {
        (*pcVar4)(src_argb1555,dst_argb,width);
        src_argb1555 = src_argb1555 + src_stride_argb1555;
        dst_argb = dst_argb + dst_stride_argb;
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

LIBYUV_API
int ARGB1555ToARGB(const uint8_t* src_argb1555,
                   int src_stride_argb1555,
                   uint8_t* dst_argb,
                   int dst_stride_argb,
                   int width,
                   int height) {
  int y;
  void (*ARGB1555ToARGBRow)(const uint8_t* src_argb1555, uint8_t* dst_argb,
                            int width) = ARGB1555ToARGBRow_C;
  if (!src_argb1555 || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_argb1555 = src_argb1555 + (height - 1) * src_stride_argb1555;
    src_stride_argb1555 = -src_stride_argb1555;
  }
  // Coalesce rows.
  if (src_stride_argb1555 == width * 2 && dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    src_stride_argb1555 = dst_stride_argb = 0;
  }
#if defined(HAS_ARGB1555TOARGBROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    ARGB1555ToARGBRow = ARGB1555ToARGBRow_Any_SSE2;
    if (IS_ALIGNED(width, 8)) {
      ARGB1555ToARGBRow = ARGB1555ToARGBRow_SSE2;
    }
  }
#endif
#if defined(HAS_ARGB1555TOARGBROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    ARGB1555ToARGBRow = ARGB1555ToARGBRow_Any_AVX2;
    if (IS_ALIGNED(width, 16)) {
      ARGB1555ToARGBRow = ARGB1555ToARGBRow_AVX2;
    }
  }
#endif
#if defined(HAS_ARGB1555TOARGBROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    ARGB1555ToARGBRow = ARGB1555ToARGBRow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      ARGB1555ToARGBRow = ARGB1555ToARGBRow_NEON;
    }
  }
#endif
#if defined(HAS_ARGB1555TOARGBROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    ARGB1555ToARGBRow = ARGB1555ToARGBRow_Any_MMI;
    if (IS_ALIGNED(width, 4)) {
      ARGB1555ToARGBRow = ARGB1555ToARGBRow_MMI;
    }
  }
#endif
#if defined(HAS_ARGB1555TOARGBROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    ARGB1555ToARGBRow = ARGB1555ToARGBRow_Any_MSA;
    if (IS_ALIGNED(width, 16)) {
      ARGB1555ToARGBRow = ARGB1555ToARGBRow_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    ARGB1555ToARGBRow(src_argb1555, dst_argb, width);
    src_argb1555 += src_stride_argb1555;
    dst_argb += dst_stride_argb;
  }
  return 0;
}